

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t extraout_RDX;
  uint64_t Address_01;
  uint RegNo;
  
  RegNo = Insn >> 8 & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if (uVar1 == 0x988) {
    DVar2 = DecoderGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
    Address_01 = extraout_RDX;
    if ((DVar2 | 2) == MCDisassembler_Success) goto LAB_00151b71;
LAB_00151bb2:
    DVar2 = MCDisassembler_Fail;
  }
  else {
    DVar2 = MCDisassembler_Success;
    Address_01 = Address_00;
LAB_00151b71:
    DVar3 = DecoderGPRRegisterClass(Inst,RegNo,Address_01,Decoder);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) goto LAB_00151bb2;
      DVar2 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)(Insn >> 0xf & 0x800 | Insn >> 4 & 0xf700 | Insn & 0xff));
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeT2MOVTWInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 8, 4);
	unsigned imm = 0;

	imm |= (fieldFromInstruction_4(Insn, 0, 8) << 0);
	imm |= (fieldFromInstruction_4(Insn, 12, 3) << 8);
	imm |= (fieldFromInstruction_4(Insn, 16, 4) << 12);
	imm |= (fieldFromInstruction_4(Insn, 26, 1) << 11);

	if (MCInst_getOpcode(Inst) == ARM_t2MOVTi16)
		if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, imm);

	return S;
}